

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

void __thiscall
slang::ast::ForwardingTypedefSymbol::serializeTo
          (ForwardingTypedefSymbol *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  sVar1 = ast::toString(this->typeRestriction);
  ASTSerializer::write(serializer,8,"category",sVar1._M_len);
  if (this->next != (ForwardingTypedefSymbol *)0x0) {
    ASTSerializer::write(serializer,4,"next",(size_t)this->next);
    return;
  }
  return;
}

Assistant:

void ForwardingTypedefSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("category", toString(typeRestriction));
    if (next)
        serializer.write("next", *next);
}